

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O0

int Vec_BitCount(Vec_Bit_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int local_24;
  int local_20;
  int Counter;
  int i;
  int nWords;
  uint *pArray;
  Vec_Bit_t *p_local;
  
  piVar1 = p->pArray;
  iVar2 = (p->nSize >> 5) + (uint)((p->nSize & 0x1fU) != 0);
  local_24 = 0;
  if ((p->nSize & 0x1fU) == 0) {
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      iVar3 = Vec_BitCountWord(piVar1[local_20]);
      local_24 = iVar3 + local_24;
    }
  }
  else {
    if (iVar2 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                    ,0x256,"int Vec_BitCount(Vec_Bit_t *)");
    }
    for (local_20 = 0; local_20 < iVar2 + -1; local_20 = local_20 + 1) {
      iVar3 = Vec_BitCountWord(piVar1[local_20]);
      local_24 = iVar3 + local_24;
    }
    iVar2 = Vec_BitCountWord(piVar1[local_20] & (-1 << ((byte)p->nSize & 0x1f) ^ 0xffffffffU));
    local_24 = iVar2 + local_24;
  }
  return local_24;
}

Assistant:

static inline int Vec_BitCount( Vec_Bit_t * p ) 
{
    unsigned * pArray = (unsigned *)p->pArray;
    int nWords = (p->nSize >> 5) + ((p->nSize & 31) > 0);
    int i, Counter = 0;
    if ( p->nSize & 31 )
    {
        assert( nWords > 0 );
        for ( i = 0; i < nWords-1; i++ )
            Counter += Vec_BitCountWord( pArray[i] );
        Counter += Vec_BitCountWord( pArray[i] & ~(~0 << (p->nSize & 31)) );
    }
    else
    {
        for ( i = 0; i < nWords; i++ )
            Counter += Vec_BitCountWord( pArray[i] );
    }
    return Counter;
}